

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp:754:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_json_object_cpp:754:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr_untyped local_20;
  
  local_20.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_20.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  if (local_20.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_20.heap_,&local_20);
  }
  json_stringify(__return_storage_ptr__,(gc_heap_ptr<mjs::global_object> *)&local_20,args);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_20);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }